

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtVector3.h
# Opt level: O2

cbtVector3 operator*(cbtVector3 *v1,cbtVector3 *v2)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  cbtVector3 cVar3;
  
  auVar2._0_4_ = (float)*(undefined8 *)(v1->m_floats + 1) * (float)*(undefined8 *)(v2->m_floats + 1)
  ;
  auVar2._4_4_ = (float)((ulong)*(undefined8 *)(v1->m_floats + 1) >> 0x20) *
                 (float)((ulong)*(undefined8 *)(v2->m_floats + 1) >> 0x20);
  auVar2._8_8_ = 0;
  auVar1 = vinsertps_avx(ZEXT416((uint)(v1->m_floats[0] * v2->m_floats[0])),auVar2,0x1c);
  auVar2 = vinsertps_avx(auVar1,auVar2,0x4e);
  cVar3.m_floats._0_8_ = auVar1._0_8_;
  cVar3.m_floats._8_8_ = auVar2._0_8_;
  return (cbtVector3)cVar3.m_floats;
}

Assistant:

SIMD_FORCE_INLINE cbtVector3
operator*(const cbtVector3& v1, const cbtVector3& v2)
{
#if defined(BT_USE_SSE_IN_API) && defined(BT_USE_SSE)
	return cbtVector3(_mm_mul_ps(v1.mVec128, v2.mVec128));
#elif defined(BT_USE_NEON)
	return cbtVector3(vmulq_f32(v1.mVec128, v2.mVec128));
#else
	return cbtVector3(
		v1.m_floats[0] * v2.m_floats[0],
		v1.m_floats[1] * v2.m_floats[1],
		v1.m_floats[2] * v2.m_floats[2]);
#endif
}